

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_prologTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  uint *puVar8;
  char **ppcVar9;
  ATTRIBUTE *pAVar10;
  uint uVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  long lVar13;
  int iVar14;
  int iVar15;
  byte *pbVar16;
  byte *pbVar17;
  uint uVar12;
  
  if (end <= ptr) {
    return -4;
  }
  bVar3 = false;
  iVar4 = 0;
  iVar14 = 0x12;
  lVar13 = 1;
  puVar8 = &switchD_0062c5cc::switchdataD_007fd3c0;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 2:
    pbVar16 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar16 || (long)end - (long)pbVar16 < 0) goto LAB_0062ca39;
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar16);
    switch(bVar2) {
    case 0xf:
      iVar4 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x10:
      iVar4 = normal_scanDecl(enc,ptr + 2,end,nextTokPtr);
      return iVar4;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x17:
      goto switchD_0062ca87_caseD_11;
    case 0x16:
    case 0x18:
switchD_0062ca87_caseD_16:
      *nextTokPtr = ptr;
      return 0x1d;
    default:
      if ((bVar2 - 5 < 3) || (bVar2 == 0x1d)) goto switchD_0062ca87_caseD_16;
switchD_0062ca87_caseD_11:
      *nextTokPtr = (char *)pbVar16;
    }
    goto LAB_0062cd6e;
  default:
    *nextTokPtr = ptr;
    break;
  case 4:
    pcVar7 = ptr + 1;
    if ((long)end - (long)pcVar7 < 1) {
      iVar4 = -0x1a;
    }
    else {
      if (*pcVar7 == ']') {
        if ((long)end - (long)pcVar7 == 1) {
          return -1;
        }
        if (ptr[2] == '>') {
          *nextTokPtr = ptr + 3;
          return 0x22;
        }
      }
      *nextTokPtr = pcVar7;
      iVar4 = 0x1a;
    }
    break;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar4 = (*enc[3].nameLength)(enc,ptr);
    if (iVar4 != 0) goto LAB_0062c929;
    iVar4 = (*enc[3].literalScanners[0])(enc,ptr,extraout_RDX_02,(char **)puVar8);
    lVar13 = 2;
    if (iVar4 != 0) {
LAB_0062cb31:
      bVar3 = false;
      goto switchD_0062c5cc_caseD_16;
    }
    iVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_03,(char **)puVar8);
LAB_0062cd5f:
    if (iVar4 != 0) goto switchD_0062c5cc_caseD_19;
switchD_0062c615_caseD_8:
    *nextTokPtr = ptr;
    goto LAB_0062cd6e;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    pcVar7 = (*enc[3].skipS)(enc,ptr);
    if ((int)pcVar7 == 0) {
      iVar4 = (*enc[3].literalScanners[1])(enc,ptr,extraout_RDX_06,(char **)puVar8);
      lVar13 = 3;
      if (iVar4 != 0) goto LAB_0062cb31;
      iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_08,(char **)puVar8);
      goto LAB_0062cd5f;
    }
    goto LAB_0062c929;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar4 = (*enc[3].getAtts)(enc,ptr,(int)end,(ATTRIBUTE *)&switchD_0062c5cc::switchdataD_007fd3c0)
    ;
    if (iVar4 == 0) {
      iVar4 = (*enc[3].nameMatchesAscii)(enc,ptr,extraout_RDX_04,(char *)puVar8);
      lVar13 = 4;
      if (iVar4 != 0) goto LAB_0062cb31;
      iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_05,(char **)puVar8);
      goto LAB_0062cd5f;
    }
LAB_0062c929:
    *nextTokPtr = ptr;
    goto LAB_0062cd6e;
  case 9:
    if (ptr + 1 == end) {
      *nextTokPtr = end;
      return -0xf;
    }
  case 10:
  case 0x15:
    pbVar16 = (byte *)(ptr + 1);
    lVar13 = (long)end - (long)pbVar16;
    pbVar17 = pbVar16;
    for (; (0 < lVar13 &&
           (((cVar1 = *(char *)((long)enc[1].scanners + (ulong)*pbVar16), cVar1 == '\x15' ||
             (cVar1 == '\n')) ||
            ((pbVar17 = pbVar16, cVar1 == '\t' && (pbVar16 + 1 != (byte *)end))))));
        pbVar16 = pbVar16 + 1) {
      lVar13 = lVar13 + -1;
      pbVar17 = (byte *)end;
    }
    *nextTokPtr = (char *)pbVar17;
    iVar4 = 0xf;
    break;
  case 0xb:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x11;
    break;
  case 0xc:
    iVar4 = 0xc;
    goto LAB_0062c839;
  case 0xd:
    iVar4 = 0xd;
LAB_0062c839:
    iVar4 = normal_scanLit(iVar4,enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 0x13:
    pbVar16 = (byte *)(ptr + 1);
    uVar6 = (long)end - (long)pbVar16;
    if (0 < (long)uVar6) {
      pAVar10 = (ATTRIBUTE *)(ulong)*pbVar16;
      bVar2 = *(byte *)((long)&pAVar10->name + (long)enc[1].scanners);
      iVar15 = 0;
      iVar14 = 0;
      iVar4 = iVar15;
      if (bVar2 < 7) {
        if (bVar2 == 5) {
          if (uVar6 == 1) {
            return -2;
          }
          iVar5 = (*enc[3].nameLength)(enc,(char *)pbVar16);
          iVar4 = iVar14;
          if (iVar5 != 0) goto LAB_0062cdab;
          iVar5 = (*enc[3].literalScanners[0])(enc,(char *)pbVar16,extraout_RDX_10,&pAVar10->name);
          lVar13 = 2;
        }
        else {
          iVar4 = iVar14;
          if (bVar2 != 6) goto LAB_0062cdab;
          if (uVar6 < 3) {
            return -2;
          }
          pcVar7 = (*enc[3].skipS)(enc,(char *)pbVar16);
          if ((int)pcVar7 != 0) goto LAB_0062cdab;
          iVar5 = (*enc[3].literalScanners[1])(enc,(char *)pbVar16,extraout_RDX_07,&pAVar10->name);
          lVar13 = 3;
        }
      }
      else {
        if (bVar2 != 7) {
          lVar13 = 1;
          if ((bVar2 != 0x16) && (bVar2 != 0x18)) goto LAB_0062cdab;
          goto LAB_0062cc09;
        }
        if (uVar6 < 4) {
          return -2;
        }
        iVar5 = (*enc[3].getAtts)(enc,(char *)pbVar16,7,pAVar10);
        if (iVar5 != 0) goto LAB_0062cdab;
        iVar5 = (*enc[3].nameMatchesAscii)(enc,(char *)pbVar16,extraout_RDX_09,(char *)pAVar10);
        lVar13 = 4;
      }
      iVar4 = iVar15;
      if (iVar5 == 0) {
LAB_0062cdab:
        *nextTokPtr = (char *)pbVar16;
        return iVar4;
      }
LAB_0062cc09:
      pbVar16 = pbVar16 + lVar13;
      uVar6 = (long)end - (long)pbVar16;
      if ((long)uVar6 < 1) {
        return -0x14;
      }
LAB_0062cc27:
      uVar12 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*pbVar16);
      uVar11 = uVar12 - 5;
      iVar4 = iVar15;
      if (0x1f < uVar11) goto switchD_0062cc4c_caseD_8;
      ppcVar9 = (char **)0x1;
      switch(uVar12) {
      case 5:
        if (uVar6 == 1) {
          return -2;
        }
        iVar5 = (*enc[3].nameLength)(enc,(char *)pbVar16);
        iVar4 = iVar14;
        if (iVar5 == 0) {
          iVar5 = (*enc[3].scanners[0])(enc,(char *)pbVar16,extraout_RDX_11,ppcVar9);
          ppcVar9 = (char **)0x2;
LAB_0062cce3:
          iVar4 = iVar14;
          if (iVar5 != 0) goto switchD_0062cc4c_caseD_16;
        }
        break;
      case 6:
        if (uVar6 < 3) {
          return -2;
        }
        pcVar7 = (*enc[3].skipS)(enc,(char *)pbVar16);
        iVar4 = iVar14;
        if ((int)pcVar7 == 0) {
          iVar5 = (*enc[3].scanners[1])(enc,(char *)pbVar16,extraout_RDX_12,ppcVar9);
          ppcVar9 = (char **)0x3;
          goto LAB_0062cce3;
        }
        break;
      case 7:
        if (uVar6 < 4) {
          return -2;
        }
        iVar5 = (*enc[3].getAtts)(enc,(char *)pbVar16,
                                  (&switchD_0062cc4c::switchdataD_007fd4cc)[uVar11] + 0x7fd4cc,
                                  (ATTRIBUTE *)0x1);
        if (iVar5 == 0) {
          iVar5 = (*enc[3].scanners[2])(enc,(char *)pbVar16,extraout_RDX_13,ppcVar9);
          ppcVar9 = (char **)0x4;
          goto LAB_0062cce3;
        }
        break;
      case 9:
      case 10:
      case 0xb:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x24:
        iVar4 = 0x14;
        break;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0062cc4c_caseD_16;
      }
switchD_0062cc4c_caseD_8:
      goto LAB_0062cdab;
    }
LAB_0062ca39:
    iVar4 = -1;
    break;
  case 0x14:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x19;
    break;
  case 0x16:
  case 0x18:
    goto switchD_0062c5cc_caseD_16;
  case 0x19:
  case 0x1a:
  case 0x1b:
switchD_0062c5cc_caseD_19:
    iVar14 = 0x13;
    bVar3 = true;
switchD_0062c5cc_caseD_16:
    ptr = ptr + lVar13;
    do {
      uVar6 = (long)end - (long)ptr;
      if ((long)uVar6 < 1) {
        return -iVar14;
      }
      uVar12 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
      uVar11 = uVar12 - 5;
      if (0x1f < uVar11) goto switchD_0062c615_caseD_8;
      ppcVar9 = (char **)0x1;
      switch(uVar12) {
      case 5:
        if (uVar6 == 1) {
          return -2;
        }
        iVar4 = (*enc[3].nameLength)(enc,ptr);
        if (iVar4 != 0) goto switchD_0062c615_caseD_8;
        iVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX,ppcVar9);
        ppcVar9 = (char **)0x2;
        break;
      case 6:
        if (uVar6 < 3) {
          return -2;
        }
        pcVar7 = (*enc[3].skipS)(enc,ptr);
        if ((int)pcVar7 != 0) goto switchD_0062c615_caseD_8;
        iVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_00,ppcVar9);
        ppcVar9 = (char **)0x3;
        break;
      case 7:
        if (uVar6 < 4) {
          return -2;
        }
        iVar4 = (*enc[3].getAtts)(enc,ptr,(&switchD_0062c615::switchdataD_007fd44c)[uVar11] +
                                          0x7fd44c,(ATTRIBUTE *)0x1);
        if (iVar4 != 0) goto switchD_0062c615_caseD_8;
        iVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcVar9);
        ppcVar9 = (char **)0x4;
        break;
      default:
        goto switchD_0062c615_caseD_8;
      case 9:
      case 10:
      case 0xb:
      case 0x14:
      case 0x15:
      case 0x1e:
      case 0x20:
      case 0x23:
      case 0x24:
        *nextTokPtr = ptr;
        return iVar14;
      case 0xf:
        if (!bVar3) {
          *nextTokPtr = (char *)((byte *)ptr + 1);
          return 0x1e;
        }
        goto switchD_0062c615_caseD_8;
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
        goto switchD_0062c615_caseD_16;
      case 0x21:
        if (!bVar3) {
          *nextTokPtr = (char *)((byte *)ptr + 1);
          return 0x1f;
        }
        goto switchD_0062c615_caseD_8;
      case 0x22:
        if (!bVar3) {
          *nextTokPtr = (char *)((byte *)ptr + 1);
          return 0x20;
        }
        goto switchD_0062c615_caseD_8;
      }
      if (iVar4 == 0) goto switchD_0062c615_caseD_8;
switchD_0062c615_caseD_16:
      ptr = (char *)((byte *)ptr + (long)ppcVar9);
    } while( true );
  case 0x1e:
    iVar4 = normal_scanPercent(enc,ptr + 1,end,nextTokPtr);
    return iVar4;
  case 0x1f:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x17;
    break;
  case 0x20:
    pbVar16 = (byte *)(ptr + 1);
    if ((byte *)end == pbVar16 || (long)end - (long)pbVar16 < 0) {
      return -0x18;
    }
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)*pbVar16);
    if (bVar2 < 0x20) {
      if (bVar2 - 9 < 3) {
switchD_0062cab4_caseD_20:
        *nextTokPtr = (char *)pbVar16;
        return 0x18;
      }
      if (bVar2 == 0xf) {
        *nextTokPtr = ptr + 2;
        return 0x23;
      }
      if (bVar2 == 0x15) goto switchD_0062cab4_caseD_20;
    }
    else {
      switch(bVar2) {
      case 0x20:
      case 0x23:
      case 0x24:
        goto switchD_0062cab4_caseD_20;
      case 0x21:
        *nextTokPtr = ptr + 2;
        return 0x24;
      case 0x22:
        *nextTokPtr = ptr + 2;
        return 0x25;
      }
    }
    *nextTokPtr = (char *)pbVar16;
LAB_0062cd6e:
    iVar4 = 0;
    break;
  case 0x23:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x26;
    break;
  case 0x24:
    *nextTokPtr = ptr + 1;
    iVar4 = 0x15;
  }
  return iVar4;
switchD_0062cc4c_caseD_16:
  pbVar16 = pbVar16 + (long)ppcVar9;
  uVar6 = (long)end - (long)pbVar16;
  if ((long)uVar6 < 1) {
    return -0x14;
  }
  goto LAB_0062cc27;
}

Assistant:

static int PTRCALL
PREFIX(prologTok)(const ENCODING *enc, const char *ptr, const char *end,
                  const char **nextTokPtr) {
  int tok;
  if (ptr >= end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_QUOT:
    return PREFIX(scanLit)(BT_QUOT, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_APOS:
    return PREFIX(scanLit)(BT_APOS, enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_LT: {
    ptr += MINBPC(enc);
    REQUIRE_CHAR(enc, ptr, end);
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_EXCL:
      return PREFIX(scanDecl)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_QUEST:
      return PREFIX(scanPi)(enc, ptr + MINBPC(enc), end, nextTokPtr);
    case BT_NMSTRT:
    case BT_HEX:
    case BT_NONASCII:
    case BT_LEAD2:
    case BT_LEAD3:
    case BT_LEAD4:
      *nextTokPtr = ptr - MINBPC(enc);
      return XML_TOK_INSTANCE_START;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  case BT_CR:
    if (ptr + MINBPC(enc) == end) {
      *nextTokPtr = end;
      /* indicate that this might be part of a CR/LF pair */
      return -XML_TOK_PROLOG_S;
    }
    /* fall through */
  case BT_S:
  case BT_LF:
    for (;;) {
      ptr += MINBPC(enc);
      if (! HAS_CHAR(enc, ptr, end))
        break;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S:
      case BT_LF:
        break;
      case BT_CR:
        /* don't split CR/LF pair */
        if (ptr + MINBPC(enc) != end)
          break;
        /* fall through */
      default:
        *nextTokPtr = ptr;
        return XML_TOK_PROLOG_S;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_PROLOG_S;
  case BT_PERCNT:
    return PREFIX(scanPercent)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_COMMA:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_COMMA;
  case BT_LSQB:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_BRACKET;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_BRACKET;
    if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
      REQUIRE_CHARS(enc, ptr, end, 2);
      if (CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_GT)) {
        *nextTokPtr = ptr + 2 * MINBPC(enc);
        return XML_TOK_COND_SECT_CLOSE;
      }
    }
    *nextTokPtr = ptr;
    return XML_TOK_CLOSE_BRACKET;
  case BT_LPAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OPEN_PAREN;
  case BT_RPAR:
    ptr += MINBPC(enc);
    if (! HAS_CHAR(enc, ptr, end))
      return -XML_TOK_CLOSE_PAREN;
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_AST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_ASTERISK;
    case BT_QUEST:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_QUESTION;
    case BT_PLUS:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_CLOSE_PAREN_PLUS;
    case BT_CR:
    case BT_LF:
    case BT_S:
    case BT_GT:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_RPAR:
      *nextTokPtr = ptr;
      return XML_TOK_CLOSE_PAREN;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  case BT_VERBAR:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_OR;
  case BT_GT:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DECL_CLOSE;
  case BT_NUM:
    return PREFIX(scanPoundName)(enc, ptr + MINBPC(enc), end, nextTokPtr);
#  define LEAD_CASE(n)                                                         \
  case BT_LEAD##n:                                                             \
    if (end - ptr < n)                                                         \
      return XML_TOK_PARTIAL_CHAR;                                             \
    if (IS_INVALID_CHAR(enc, ptr, n)) {                                        \
      *nextTokPtr = ptr;                                                       \
      return XML_TOK_INVALID;                                                  \
    }                                                                          \
    if (IS_NMSTRT_CHAR(enc, ptr, n)) {                                         \
      ptr += n;                                                                \
      tok = XML_TOK_NAME;                                                      \
      break;                                                                   \
    }                                                                          \
    if (IS_NAME_CHAR(enc, ptr, n)) {                                           \
      ptr += n;                                                                \
      tok = XML_TOK_NMTOKEN;                                                   \
      break;                                                                   \
    }                                                                          \
    *nextTokPtr = ptr;                                                         \
    return XML_TOK_INVALID;
    LEAD_CASE(2)
    LEAD_CASE(3)
    LEAD_CASE(4)
#  undef LEAD_CASE
  case BT_NMSTRT:
  case BT_HEX:
    tok = XML_TOK_NAME;
    ptr += MINBPC(enc);
    break;
  case BT_DIGIT:
  case BT_NAME:
  case BT_MINUS:
#  ifdef XML_NS
  case BT_COLON:
#  endif
    tok = XML_TOK_NMTOKEN;
    ptr += MINBPC(enc);
    break;
  case BT_NONASCII:
    if (IS_NMSTRT_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NAME;
      break;
    }
    if (IS_NAME_CHAR_MINBPC(enc, ptr)) {
      ptr += MINBPC(enc);
      tok = XML_TOK_NMTOKEN;
      break;
    }
    /* fall through */
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_GT:
    case BT_RPAR:
    case BT_COMMA:
    case BT_VERBAR:
    case BT_LSQB:
    case BT_PERCNT:
    case BT_S:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return tok;
#  ifdef XML_NS
    case BT_COLON:
      ptr += MINBPC(enc);
      switch (tok) {
      case XML_TOK_NAME:
        REQUIRE_CHAR(enc, ptr, end);
        tok = XML_TOK_PREFIXED_NAME;
        switch (BYTE_TYPE(enc, ptr)) {
          CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
        default:
          tok = XML_TOK_NMTOKEN;
          break;
        }
        break;
      case XML_TOK_PREFIXED_NAME:
        tok = XML_TOK_NMTOKEN;
        break;
      }
      break;
#  endif
    case BT_PLUS:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_PLUS;
    case BT_AST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_ASTERISK;
    case BT_QUEST:
      if (tok == XML_TOK_NMTOKEN) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_NAME_QUESTION;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return -tok;
}